

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

DataArrayList *
ODDLParser::createDataArrayList(Value *currentValue,size_t numValues,Reference *refs,size_t numRefs)

{
  DataArrayList *this;
  
  this = (DataArrayList *)operator_new(0x28);
  DataArrayList::DataArrayList(this);
  this->m_dataList = currentValue;
  this->m_numItems = numValues;
  this->m_refs = refs;
  this->m_numRefs = numRefs;
  return this;
}

Assistant:

static DataArrayList *createDataArrayList( Value *currentValue, size_t numValues, 
                                           Reference *refs, size_t numRefs ) {
    DataArrayList *dataList( new DataArrayList );
    dataList->m_dataList = currentValue;
    dataList->m_numItems = numValues;
    dataList->m_refs     = refs;
    dataList->m_numRefs  = numRefs;

    return dataList;
}